

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int gmatch_aux(lua_State *L)

{
  int iVar1;
  undefined8 *puVar2;
  char *e_00;
  char *e;
  char *src;
  GMatchState *gm;
  lua_State *L_local;
  
  puVar2 = (undefined8 *)lua_touserdata(L,-0xf462b);
  puVar2[6] = L;
  e = (char *)*puVar2;
  while( true ) {
    if ((char *)puVar2[4] < e) {
      return 0;
    }
    reprepstate((MatchState *)(puVar2 + 3));
    e_00 = match((MatchState *)(puVar2 + 3),e,(char *)puVar2[1]);
    if ((e_00 != (char *)0x0) && (e_00 != (char *)puVar2[2])) break;
    e = e + 1;
  }
  puVar2[2] = e_00;
  *puVar2 = e_00;
  iVar1 = push_captures((MatchState *)(puVar2 + 3),e,e_00);
  return iVar1;
}

Assistant:

static int gmatch_aux(lua_State *L) {
    GMatchState *gm = (GMatchState *) lua_touserdata(L, lua_upvalueindex(3));
    const char *src;
    gm->ms.L = L;
    for (src = gm->src; src <= gm->ms.src_end; src++) {
        const char *e;
        reprepstate(&gm->ms);
        if ((e = match(&gm->ms, src, gm->p)) != NULL && e != gm->lastmatch) {
            gm->src = gm->lastmatch = e;
            return push_captures(&gm->ms, src, e);
        }
    }
    return 0;  /* not found */
}